

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall helics::apps::Recorder::runTo(Recorder *this,Time runToTime)

{
  element_type *peVar1;
  pointer pVVar2;
  long lVar3;
  baseType bVar4;
  ostream *poVar5;
  Federate *this_00;
  pointer pVVar6;
  format_string<std::__cxx11::basic_string<char>_&,_int_&,_double,_std::__cxx11::basic_string<char>_&>
  fmt;
  format_string<std::__cxx11::basic_string<char>_&,_int_&,_double,_std::__cxx11::basic_string<char>_&>
  fmt_00;
  iteration_time iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  int local_25c;
  long local_258;
  double local_248;
  string *local_240;
  baseType local_238;
  ofstream out;
  
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->super_ValueFederate)._vptr_ValueFederate[-3]
      [(long)&(peVar1->super_ValueFederate).vfManager._M_t] == (_func_int)0x0) {
    (*(this->super_App)._vptr_App[2])(this);
  }
  local_240 = (string *)&this->mapfile;
  if ((this->mapfile)._M_string_length != 0) {
    std::ofstream::ofstream(&out,local_240,_S_out);
    pVVar2 = (this->vStat).
             super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pVVar6 = (this->vStat).
                  super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                  ._M_impl.super__Vector_impl_data._M_start; pVVar6 != pVVar2; pVVar6 = pVVar6 + 1)
    {
      lVar3 = (pVVar6->time).internalTimeCode;
      local_248 = (double)(lVar3 % 1000000000) * 1e-09 + (double)(lVar3 / 1000000000);
      fmt.str.size_ = (size_t)&pVVar6->key;
      fmt.str.data_ = (char *)0xc;
      ::fmt::v11::print<std::__cxx11::string&,int&,double,std::__cxx11::string&>
                ((v11 *)&out,(ostream *)"{}\t{}\t{}\t{}\n",fmt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pVVar6->cnt,
                 (int *)&local_248,(double *)&pVVar6->lastVal,in_stack_fffffffffffffd90);
    }
    std::ostream::flush();
    std::ofstream::~ofstream(&out);
  }
  lVar3 = (this->nextPrintTimeStep).internalTimeCode;
  local_258 = 0x7fffffffffffffff;
  if (0 < lVar3) {
    local_258 = lVar3;
  }
  local_25c = 0;
  while( true ) {
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (Federate *)
              ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
              (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]);
    if (this->allow_iteration == true) {
      iVar7 = Federate::requestTimeIterative(this_00,runToTime,ITERATE_IF_NEEDED);
      if (iVar7.state == NEXT_STEP) {
        local_25c = 0;
      }
      captureForCurrentTime(this,iVar7.grantedTime.internalTimeCode,local_25c);
      local_25c = local_25c + 1;
      local_238 = iVar7.grantedTime.internalTimeCode.internalTimeCode;
    }
    else {
      local_238 = (baseType)Federate::requestTime(this_00,runToTime);
      captureForCurrentTime(this,(Time)local_238,0);
    }
    if ((this->mapfile)._M_string_length != 0) {
      std::ofstream::ofstream((v11 *)&out,local_240,_S_out);
      pVVar2 = (this->vStat).
               super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pVVar6 = (this->vStat).
                    super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                    ._M_impl.super__Vector_impl_data._M_start; pVVar6 != pVVar2; pVVar6 = pVVar6 + 1
          ) {
        lVar3 = (pVVar6->time).internalTimeCode;
        local_248 = (double)(lVar3 % 1000000000) * 1e-09 + (double)(lVar3 / 1000000000);
        fmt_00.str.size_ = (size_t)&pVVar6->key;
        fmt_00.str.data_ = (char *)0xc;
        ::fmt::v11::print<std::__cxx11::string&,int&,double,std::__cxx11::string&>
                  ((v11 *)&out,(ostream *)"{}\t{}\t{}\t{}\n",fmt_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pVVar6->cnt
                   ,(int *)&local_248,(double *)&pVVar6->lastVal,in_stack_fffffffffffffd90);
      }
      std::ostream::flush();
      std::ofstream::~ofstream((v11 *)&out);
    }
    bVar4 = local_238;
    if (runToTime.internalTimeCode <= local_238) break;
    if ((local_258 <= local_238) && (0 < (this->nextPrintTimeStep).internalTimeCode)) {
      std::operator<<((ostream *)&std::cout,"processed for time ");
      poVar5 = std::ostream::_M_insert<double>
                         ((double)(bVar4 % 1000000000) * 1e-09 + (double)(bVar4 / 1000000000));
      std::operator<<(poVar5,"\n");
      local_258 = local_258 + (this->nextPrintTimeStep).internalTimeCode;
    }
  }
  return;
}

Assistant:

void Recorder::runTo(Time runToTime)
{
    if (fed->getCurrentMode() == Federate::Modes::STARTUP) {
        initialize();
    }

    if (!mapfile.empty()) {
        std::ofstream out(mapfile);
        for (auto& stat : vStat) {
            //    out << stat.key << "\t" << stat.cnt << '\t' << static_cast<double> (stat.time)
            //    << '\t' << stat.lastVal
            //        << '\n';
            fmt::print(out,
                       "{}\t{}\t{}\t{}\n",
                       stat.key,
                       stat.cnt,
                       static_cast<double>(stat.time),
                       stat.lastVal);
        }
        out.flush();
    }
    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    try {
        int iteration = 0;
        while (true) {
            helics::Time grantedTime;
            if (allow_iteration) {
                auto ItRes =
                    fed->requestTimeIterative(runToTime, IterationRequest::ITERATE_IF_NEEDED);
                if (ItRes.state == IterationResult::NEXT_STEP) {
                    iteration = 0;
                }
                grantedTime = ItRes.grantedTime;
                captureForCurrentTime(grantedTime, iteration);
                ++iteration;
            } else {
                grantedTime = fed->requestTime(runToTime);
                captureForCurrentTime(grantedTime);
            }
            if (!mapfile.empty()) {
                std::ofstream out(mapfile);
                for (auto& stat : vStat) {
                    fmt::print(out,
                               "{}\t{}\t{}\t{}\n",
                               stat.key,
                               stat.cnt,
                               static_cast<double>(stat.time),
                               stat.lastVal);
                }
                out.flush();
            }
            if (grantedTime >= runToTime) {
                break;
            }
            if ((grantedTime >= nextPrintTime) && (nextPrintTimeStep > timeZero)) {
                std::cout << "processed for time " << static_cast<double>(grantedTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        }
    }
    catch (...) {
        std::cerr << "error generate on run\n";
    }
}